

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

Clause * Kernel::Clause::fromClause(Clause *c)

{
  undefined4 uVar1;
  SplitSet *pSVar2;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  litit;
  Clause *pCVar3;
  undefined4 uStack_54;
  SimplifyingInference1 local_50;
  Inference local_40;
  
  uVar1 = *(undefined4 *)&c->field_0x38;
  local_50.rule = REORDER_LITERALS;
  local_50.premise = c;
  Inference::Inference(&local_40,&local_50);
  litit._iter._inner._next = 0;
  litit._iter._inner._from = 0;
  litit._iter._func.a = c;
  litit._iter._16_8_ = CONCAT44(uStack_54,uVar1) & 0xffffffff000fffff;
  pCVar3 = fromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
                     (litit,&local_40);
  pSVar2 = (c->super_Unit)._inference._splits;
  if (pSVar2 != (SplitSet *)0x0) {
    (pCVar3->super_Unit)._inference._splits = pSVar2;
  }
  return pCVar3;
}

Assistant:

Clause* Clause::fromClause(Clause* c)
{
  Clause* res = fromIterator(c->iterLits(), SimplifyingInference1(InferenceRule::REORDER_LITERALS, c));

  if (c->splits()) {
    res->setSplits(c->splits());
  }

  return res;
}